

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_lib_init(void)

{
  rlim_t rVar1;
  int iVar2;
  uint uVar3;
  __pid_t _Var4;
  ulong uVar5;
  size_t sVar6;
  block_s *blk;
  char *pcVar7;
  size_t sVar8;
  fio_data_s *pfVar9;
  int *piVar10;
  uint uVar11;
  ulong fd;
  rlimit rlim;
  rlimit local_48;
  
  uVar5 = sysconf(4);
  local_48.rlim_cur = 0;
  local_48.rlim_max = 0;
  iVar2 = getrlimit(RLIMIT_NOFILE,&local_48);
  rVar1 = local_48.rlim_cur;
  if (iVar2 == -1) {
    fio_lib_init_cold_1();
  }
  else {
    if (0x20000 < local_48.rlim_max) {
      local_48.rlim_max = 0x20000;
    }
    local_48.rlim_cur = local_48.rlim_max;
    iVar2 = setrlimit(RLIMIT_NOFILE,&local_48);
    if (rVar1 < local_48.rlim_cur && iVar2 == -1) {
      do {
        local_48.rlim_cur = local_48.rlim_cur - 1;
        iVar2 = setrlimit(RLIMIT_NOFILE,&local_48);
        if (iVar2 != -1) break;
      } while (rVar1 < local_48.rlim_cur);
    }
    getrlimit(RLIMIT_NOFILE,&local_48);
    uVar5 = local_48.rlim_cur - 0x10;
    if ((long)local_48.rlim_cur < 0x401) {
      uVar5 = local_48.rlim_cur;
    }
  }
  if (arenas == (arena_s *)0x0) {
    sVar6 = sysconf(0x54);
    memory.cores = 8;
    if (0 < (long)sVar6) {
      memory.cores = sVar6;
    }
    arenas = (arena_s *)big_alloc(memory.cores << 4);
    if (arenas != (arena_s *)0x0) {
      blk = block_new();
      block_free(blk);
      pthread_atfork((__prepare *)0x0,(__parent *)0x0,fio_malloc_after_fork);
      goto LAB_0012e14b;
    }
    if (FIO_LOG_LEVEL < 1) goto LAB_0012e35e;
    pcVar7 = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7305"
    ;
  }
  else {
LAB_0012e14b:
    fio_poll_init();
    fio_cluster_data_cleanup(0);
    pcVar7 = getenv("TMPDIR");
    if (pcVar7 == (char *)0x0) {
LAB_0012e17f:
      uVar11 = 4;
      pcVar7 = "/tmp";
    }
    else {
      sVar8 = strlen(pcVar7);
      uVar11 = (uint)sVar8;
      if (0xe3 < uVar11) goto LAB_0012e17f;
    }
    sVar8 = (size_t)uVar11;
    if (0xe2 < uVar11) {
      sVar8 = 0;
    }
    uVar3 = (uint)sVar8;
    uVar11 = 0;
    if ((uVar3 != 0) &&
       (memcpy(cluster_data.name,pcVar7,sVar8), uVar11 = uVar3, cluster_data.name[uVar3 - 1] != '/')
       ) {
      uVar11 = uVar3 + 1;
      cluster_data.name[sVar8] = '/';
    }
    builtin_strncpy(cluster_data.name + (ulong)uVar11 + 6,"io-sock-",8);
    builtin_strncpy(cluster_data.name + uVar11,"facil-io",8);
    uVar3 = getpid();
    pfVar9 = (fio_data_s *)0x0;
    iVar2 = snprintf(cluster_data.name + (uVar11 + 0xe),(ulong)(0xf1 - uVar11),"%d",(ulong)uVar3);
    cluster_data.name[iVar2 + uVar11 + 0xe] = '\0';
    unlink(cluster_data.name);
    fio_state_callback_add(FIO_CALL_AT_EXIT,fio_cluster_cleanup,(void *)0x0);
    fio_state_callback_add(FIO_CALL_PRE_START,fio_listen2cluster,(void *)0x0);
    fio_state_callback_add(FIO_CALL_IN_MASTER,fio_accept_after_fork,(void *)0x0);
    fio_state_callback_add(FIO_CALL_IN_CHILD,fio_connect2cluster,(void *)0x0);
    fio_state_callback_add(FIO_CALL_ON_FINISH,fio_cluster_cleanup,(void *)0x0);
    fio_state_callback_add(FIO_CALL_AT_EXIT,fio_cluster_at_exit,(void *)0x0);
    sVar6 = uVar5 * 0xa8 + 0x40;
    if (sVar6 != 0) {
      pfVar9 = (fio_data_s *)big_alloc(sVar6);
    }
    if (pfVar9 != (fio_data_s *)0x0) {
      fio_data = pfVar9;
      pfVar9->capa = (uint32_t)uVar5;
      _Var4 = getpid();
      pfVar9 = fio_data;
      fio_data->parent = _Var4;
      pfVar9->connection_count = 0;
      clock_gettime(0,(timespec *)pfVar9);
      if (0 < (long)uVar5) {
        fd = 0;
        do {
          fio_clear_fd(fd,'\0');
          fd = fd + 1;
        } while (uVar5 != fd);
      }
      fio_state_callback_force(FIO_CALL_ON_INITIALIZE);
      fio_state_callback_clear(FIO_CALL_ON_INITIALIZE);
      return;
    }
    fio_data = (fio_data_s *)0x0;
    if (FIO_LOG_LEVEL < 1) goto LAB_0012e35e;
    pcVar7 = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:3623"
    ;
  }
  FIO_LOG2STDERR(pcVar7);
LAB_0012e35e:
  kill(0,2);
  piVar10 = __errno_location();
  exit(*piVar10);
}

Assistant:

static void __attribute__((constructor)) fio_lib_init(void) {
  /* detect socket capacity - MUST be first...*/
  ssize_t capa = 0;
  {
#ifdef _SC_OPEN_MAX
    capa = sysconf(_SC_OPEN_MAX);
#elif defined(FOPEN_MAX)
    capa = FOPEN_MAX;
#endif
    // try to maximize limits - collect max and set to max
    struct rlimit rlim = {.rlim_max = 0};
    if (getrlimit(RLIMIT_NOFILE, &rlim) == -1) {
      FIO_LOG_WARNING("`getrlimit` failed in `fio_lib_init`.");
      perror("\terrno:");
    } else {
      rlim_t original = rlim.rlim_cur;
      rlim.rlim_cur = rlim.rlim_max;
      if (rlim.rlim_cur > FIO_MAX_SOCK_CAPACITY) {
        rlim.rlim_cur = rlim.rlim_max = FIO_MAX_SOCK_CAPACITY;
      }
      while (setrlimit(RLIMIT_NOFILE, &rlim) == -1 && rlim.rlim_cur > original)
        --rlim.rlim_cur;
      getrlimit(RLIMIT_NOFILE, &rlim);
      capa = rlim.rlim_cur;
      if (capa > 1024) /* leave a slice of room */
        capa -= 16;
    }
    /* initialize memory allocator */
    fio_mem_init();
    /* initialize polling engine */
    fio_poll_init();
    /* initialize the cluster engine */
    fio_pubsub_initialize();
#if DEBUG
#if FIO_ENGINE_POLL
    FIO_LOG_INFO("facil.io " FIO_VERSION_STRING " capacity initialization:\n"
                 "*    Meximum open files %zu out of %zu\n"
                 "*    Allocating %zu bytes for state handling.\n"
                 "*    %zu bytes per connection + %zu for state handling.",
                 capa, (size_t)rlim.rlim_max,
                 (sizeof(*fio_data) + (capa * (sizeof(*fio_data->poll))) +
                  (capa * (sizeof(*fio_data->info)))),
                 (sizeof(*fio_data->poll) + sizeof(*fio_data->info)),
                 sizeof(*fio_data));
#else
    FIO_LOG_INFO("facil.io " FIO_VERSION_STRING " capacity initialization:\n"
                 "*    Meximum open files %zu out of %zu\n"
                 "*    Allocating %zu bytes for state handling.\n"
                 "*    %zu bytes per connection + %zu for state handling.",
                 capa, (size_t)rlim.rlim_max,
                 (sizeof(*fio_data) + (capa * (sizeof(*fio_data->info)))),
                 (sizeof(*fio_data->info)), sizeof(*fio_data));
#endif
#endif
  }

#if FIO_ENGINE_POLL
  /* allocate and initialize main data structures by detected capacity */
  fio_data = fio_mmap(sizeof(*fio_data) + (capa * (sizeof(*fio_data->poll))) +
                      (capa * (sizeof(*fio_data->info))));
  FIO_ASSERT_ALLOC(fio_data);
  fio_data->capa = capa;
  fio_data->poll =
      (void *)((uintptr_t)(fio_data + 1) + (sizeof(fio_data->info[0]) * capa));
#else
  /* allocate and initialize main data structures by detected capacity */
  fio_data = fio_mmap(sizeof(*fio_data) + (capa * (sizeof(*fio_data->info))));
  FIO_ASSERT_ALLOC(fio_data);
  fio_data->capa = capa;
#endif
  fio_data->parent = getpid();
  fio_data->connection_count = 0;
  fio_mark_time();

  for (ssize_t i = 0; i < capa; ++i) {
    fio_clear_fd(i, 0);
#if FIO_ENGINE_POLL
    fio_data->poll[i].fd = -1;
#endif
  }

  /* call initialization callbacks */
  fio_state_callback_force(FIO_CALL_ON_INITIALIZE);
  fio_state_callback_clear(FIO_CALL_ON_INITIALIZE);
}